

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImRect local_20;
  
  pIVar2 = GImGui;
  fVar8 = (window->InnerRect).Min.x + -1.0;
  fVar4 = (window->InnerRect).Min.y + -1.0;
  fVar3 = 1.0;
  fVar7 = (window->InnerRect).Max.x + 1.0;
  fVar5 = (window->InnerRect).Max.y + 1.0;
  fVar6 = (item_rect->Min).x;
  if (((fVar8 <= fVar6) && (fVar4 <= (item_rect->Min).y)) && ((item_rect->Max).x <= fVar7)) {
    fVar9 = 0.0;
    fVar10 = 0.0;
    if ((item_rect->Max).y <= fVar5) goto LAB_00194715;
  }
  if (fVar8 <= fVar6 || window->ScrollbarX != true) {
    if ((window->ScrollbarX != false) && (fVar6 = (item_rect->Max).x, fVar7 <= fVar6)) {
      fVar6 = (fVar6 - (window->Pos).x) + (GImGui->Style).ItemSpacing.x;
      goto LAB_00194679;
    }
  }
  else {
    fVar6 = (fVar6 - (window->Pos).x) - (GImGui->Style).ItemSpacing.x;
    fVar3 = 0.0;
LAB_00194679:
    (window->ScrollTarget).x = (float)(int)(fVar6 + (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = fVar3;
    (window->ScrollTargetEdgeSnapDist).x = 0.0;
  }
  fVar6 = (item_rect->Min).y;
  if (fVar4 <= fVar6) {
    fVar6 = (item_rect->Max).y;
    if (fVar5 <= fVar6) {
      fVar6 = (fVar6 - (window->Pos).y) + (pIVar2->Style).ItemSpacing.y;
      fVar3 = 1.0;
      goto LAB_001946eb;
    }
  }
  else {
    fVar6 = (fVar6 - (window->Pos).y) - (pIVar2->Style).ItemSpacing.y;
    fVar3 = 0.0;
LAB_001946eb:
    SetScrollFromPosY(window,fVar6,fVar3);
  }
  IVar1 = CalcNextScrollFromScrollTargetAndClamp(window);
  fVar9 = IVar1.x - (window->Scroll).x;
  fVar10 = IVar1.y - (window->Scroll).y;
LAB_00194715:
  if ((window->Flags & 0x1000000) != 0) {
    local_20.Min.x = (item_rect->Min).x - fVar9;
    local_20.Min.y = (item_rect->Min).y - fVar10;
    local_20.Max.x = (item_rect->Max).x - fVar9;
    local_20.Max.y = (item_rect->Max).y - fVar10;
    IVar1 = ScrollToBringRectIntoView(window->ParentWindow,&local_20);
    fVar9 = fVar9 + IVar1.x;
    fVar10 = fVar10 + IVar1.y;
  }
  IVar1.y = fVar10;
  IVar1.x = fVar9;
  return IVar1;
}

Assistant:

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    ImVec2 delta_scroll;
    if (!window_rect.Contains(item_rect))
    {
        if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x - g.Style.ItemSpacing.x, 0.0f);
        else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x - window->Pos.x + g.Style.ItemSpacing.x, 1.0f);
        if (item_rect.Min.y < window_rect.Min.y)
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y - g.Style.ItemSpacing.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y - window->Pos.y + g.Style.ItemSpacing.y, 1.0f);

        ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
        delta_scroll = next_scroll - window->Scroll;
    }

    // Also scroll parent window to keep us into view if necessary
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        delta_scroll += ScrollToBringRectIntoView(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll));

    return delta_scroll;
}